

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O2

bikes_allowed_t parse_bike_allowance(char *value)

{
  byte bVar1;
  bikes_allowed_t bVar2;
  
  bVar1 = *value;
  bVar2 = (bikes_allowed_t)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 0x32) {
      return BA_NOT_SET - (value[1] == '\0');
    }
    if (bVar1 == 0x31) {
      return (uint)(value[1] != '\0') * 2 + BA_POSSIBLE;
    }
    if (bVar1 == 0x30) {
      return (uint)(value[1] != '\0') * 3;
    }
    bVar2 = BA_NOT_SET;
  }
  return bVar2;
}

Assistant:

bikes_allowed_t parse_bike_allowance(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return BA_UNKNOWN;
    else if (strcmp(value, "1") == 0)
        return BA_POSSIBLE;
    else if (strcmp(value, "2") == 0)
        return BA_NOT_POSSIBLE;
    else
        return BA_NOT_SET;
}